

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrayHeadSegment<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  RegSlot localRegisterID;
  code *pcVar1;
  bool bVar2;
  Var aValue;
  JavascriptArray *this_00;
  ScriptContext *pSVar3;
  ScriptContext *pSVar4;
  undefined4 *puVar5;
  SparseArraySegmentBase *aValue_00;
  JavascriptArray *array;
  OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  aValue = GetReg<unsigned_int>(this,playout->R1);
  this_00 = Js::JavascriptArray::FromAnyArray(aValue);
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
  pSVar4 = GetScriptContext(this);
  if (pSVar3 != pSVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x14cc,"(array->GetScriptContext() == GetScriptContext())",
                                "array->GetScriptContext() == GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  localRegisterID = playout->R0;
  aValue_00 = Js::JavascriptArray::GetHead(this_00);
  SetNonVarReg(this,localRegisterID,aValue_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrayHeadSegment(const unaligned T* playout)
    {
        JavascriptArray* array = JavascriptArray::FromAnyArray(GetReg(playout->R1));

        // The array is create by the built-in on the same script context
        Assert(array->GetScriptContext() == GetScriptContext());

        SetNonVarReg(playout->R0, array->GetHead());
    }